

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

void __thiscall Game::setRegularTeams(Game *this)

{
  bool bVar1;
  reference __x;
  size_type __n;
  reference rVar2;
  _Vector_base<Card,_std::allocator<Card>_> _Stack_48;
  
  for (__n = 0; __n != 4; __n = __n + 1) {
    __x = std::
          vector<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
          ::at(&this->m_playerCards,__n);
    std::vector<Card,_std::allocator<Card>_>::vector
              ((vector<Card,_std::allocator<Card>_> *)&_Stack_48,__x);
    bVar1 = contains<Card>((vector<Card,_std::allocator<Card>_> *)&_Stack_48,(Card)0x200000003);
    std::_Vector_base<Card,_std::allocator<Card>_>::~_Vector_base(&_Stack_48);
    if (bVar1) {
      rVar2 = std::vector<bool,_std::allocator<bool>_>::at(&this->m_teams,__n);
      *rVar2._M_p = *rVar2._M_p | rVar2._M_mask;
    }
  }
  return;
}

Assistant:

void Game::setRegularTeams() {
    //regular rules:
    for (size_t i = 0; i < NUMPLAYERS; i++) {
        if (contains(m_playerCards.at(i), Card(Suit::CLUBS, CardValue::QUEEN)))
            m_teams.at(i) = true;
    }
}